

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O2

void __thiscall QStackedLayout::setStackingMode(QStackedLayout *this,StackingMode stackingMode)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  QWidgetData *pQVar4;
  long *plVar5;
  QWidget *pQVar6;
  QStackedLayoutPrivate *d;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QLayout).field_0x8;
  if (*(StackingMode *)(lVar3 + 0xcc) != stackingMode) {
    *(StackingMode *)(lVar3 + 0xcc) = stackingMode;
    uVar1 = *(uint *)(lVar3 + 0xc0);
    if (uVar1 != 0) {
      if (stackingMode == StackAll) {
        local_48.x1.m_i = 0;
        local_48.y1.m_i = 0;
        local_48.x2.m_i = -1;
        local_48.y2.m_i = -1;
        pQVar6 = currentWidget(this);
        if (pQVar6 != (QWidget *)0x0) {
          pQVar4 = pQVar6->data;
          local_48.x1.m_i = (pQVar4->crect).x1.m_i;
          local_48.y1.m_i = (pQVar4->crect).y1.m_i;
          local_48.x2.m_i = (pQVar4->crect).x2.m_i;
          local_48.y2.m_i = (pQVar4->crect).y2.m_i;
        }
        uVar8 = 0;
        uVar7 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar7 = uVar8;
        }
        for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          pQVar6 = (QWidget *)
                   (**(code **)(**(long **)(*(long *)(lVar3 + 0xb8) + uVar8 * 8) + 0x68))();
          if (pQVar6 != (QWidget *)0x0) {
            iVar10 = -(uint)(local_48.x2.m_i == local_48.x1.m_i + -1);
            iVar11 = -(uint)(local_48.y2.m_i == local_48.y1.m_i + -1);
            auVar9._4_4_ = iVar10;
            auVar9._0_4_ = iVar10;
            auVar9._8_4_ = iVar11;
            auVar9._12_4_ = iVar11;
            iVar10 = movmskpd((int)pQVar6,auVar9);
            if (iVar10 != 3) {
              QWidget::setGeometry(pQVar6,&local_48);
            }
            (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,1);
          }
        }
      }
      else if ((stackingMode == StackOne) && (uVar2 = *(uint *)(lVar3 + 200), (ulong)uVar2 != 0)) {
        uVar8 = 0;
        uVar7 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar7 = uVar8;
        }
        for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          plVar5 = (long *)(**(code **)(**(long **)(*(long *)(lVar3 + 0xb8) + uVar8 * 8) + 0x68))();
          if (plVar5 != (long *)0x0) {
            (**(code **)(*plVar5 + 0x68))(plVar5,uVar2 == uVar8);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStackedLayout::setStackingMode(StackingMode stackingMode)
{
    Q_D(QStackedLayout);
    if (d->stackingMode == stackingMode)
        return;
    d->stackingMode = stackingMode;

    const int n = d->list.size();
    if (n == 0)
        return;

    switch (d->stackingMode) {
    case StackOne:
        if (const int idx = currentIndex())
            for (int i = 0; i < n; ++i)
                if (QWidget *widget = d->list.at(i)->widget())
                    widget->setVisible(i == idx);
        break;
    case StackAll: { // Turn overlay on: Make sure all widgets are the same size
        QRect geometry;
        if (const QWidget *widget = currentWidget())
            geometry = widget->geometry();
        for (int i = 0; i < n; ++i)
            if (QWidget *widget = d->list.at(i)->widget()) {
                if (!geometry.isNull())
                    widget->setGeometry(geometry);
                widget->setVisible(true);
            }
    }
        break;
    }
}